

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

size_t wasm::file_size(string *filename)

{
  size_t sVar1;
  undefined1 local_238 [8];
  ifstream infile;
  PathString local_30;
  
  Path::to_path(&local_30,filename);
  std::ifstream::ifstream(local_238,(string *)&local_30,_S_bin|_S_ate);
  std::__cxx11::string::~string((string *)&local_30);
  sVar1 = std::istream::tellg();
  std::ifstream::~ifstream(local_238);
  return sVar1;
}

Assistant:

size_t wasm::file_size(std::string filename) {
  std::ifstream infile(wasm::Path::to_path(filename),
                       std::ifstream::ate | std::ifstream::binary);
  return infile.tellg();
}